

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O2

bool_t CheckMandatory(ebml_master *Element,bool_t bWithDefault,int ForProfile)

{
  ebml_context *Context;
  ebml_element *peVar1;
  bool_t bVar2;
  int *piVar3;
  
  piVar3 = &((Element->Base).Context)->Semantic->DisabledProfile;
  while ((Context = *(ebml_context **)(piVar3 + -2), bVar2 = 1, Context != (ebml_context *)0x0 &&
         ((((((ebml_semantic *)(piVar3 + -6))->Mandatory == 0 || ((*piVar3 & ForProfile) != 0)) ||
           ((bWithDefault == 0 && (Context->HasDefault != 0)))) ||
          (peVar1 = EBML_MasterFindFirstElt(Element,Context,0,0,0), bVar2 = 0,
          peVar1 != (ebml_element *)0x0))))) {
    piVar3 = piVar3 + 8;
  }
  return bVar2;
}

Assistant:

static bool_t CheckMandatory(const ebml_master *Element, bool_t bWithDefault, int ForProfile)
{
    const ebml_semantic *i;
    for (i=Element->Base.Context->Semantic;i->eClass;++i)
    {
        if (i->Mandatory && (i->DisabledProfile & ForProfile) == 0 &&
            (bWithDefault || !i->eClass->HasDefault) &&
            !EBML_MasterFindChild(Element,i->eClass))
            return 0;
    }
    return 1;
}